

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkAllocationCallbackUtil.cpp
# Opt level: O2

ostream * vk::operator<<(ostream *str,AllocationCallbackRecord *record)

{
  ostream *poVar1;
  char *pcVar2;
  Hex<16UL> hex;
  
  switch(record->type) {
  case TYPE_ALLOCATION:
    poVar1 = std::operator<<(str,"ALLOCATION: size=");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,", alignment=");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,", scope=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(record->data).allocation.scope);
    poVar1 = std::operator<<(poVar1,", returnedPtr=");
    hex.value = (deUint64)(record->data).allocation.returnedPtr;
    break;
  case TYPE_REALLOCATION:
    poVar1 = std::operator<<(str,"REALLOCATION: original=");
    poVar1 = tcu::Format::operator<<(poVar1,(Hex<16UL>)(record->data).free.mem);
    poVar1 = std::operator<<(poVar1,", size=");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,", alignment=");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,", scope=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(record->data).reallocation.scope);
    poVar1 = std::operator<<(poVar1,", returnedPtr=");
    hex.value = (deUint64)(record->data).reallocation.returnedPtr;
    break;
  case TYPE_FREE:
    poVar1 = std::operator<<(str,"FREE: mem=");
    hex.value = (deUint64)(record->data).free.mem;
    break;
  case TYPE_INTERNAL_ALLOCATION:
  case TYPE_INTERNAL_FREE:
    poVar1 = std::operator<<(str,"INTERNAL_");
    pcVar2 = "FREE";
    if (record->type == TYPE_INTERNAL_ALLOCATION) {
      pcVar2 = "ALLOCATION";
    }
    poVar1 = std::operator<<(poVar1,pcVar2);
    poVar1 = std::operator<<(poVar1,": size=");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,", type=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(record->data).internalAllocation.type);
    poVar1 = std::operator<<(poVar1,", scope=");
    std::ostream::operator<<(poVar1,(record->data).internalAllocation.scope);
  default:
    goto switchD_008c8126_default;
  }
  tcu::Format::operator<<(poVar1,hex);
switchD_008c8126_default:
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const AllocationCallbackRecord& record)
{
	switch (record.type)
	{
		case AllocationCallbackRecord::TYPE_ALLOCATION:
			str << "ALLOCATION: size=" << record.data.allocation.size
				<< ", alignment=" << record.data.allocation.alignment
				<< ", scope=" << record.data.allocation.scope
				<< ", returnedPtr=" << tcu::toHex(record.data.allocation.returnedPtr);
			break;

		case AllocationCallbackRecord::TYPE_REALLOCATION:
			str << "REALLOCATION: original=" << tcu::toHex(record.data.reallocation.original)
				<< ", size=" << record.data.reallocation.size
				<< ", alignment=" << record.data.reallocation.alignment
				<< ", scope=" << record.data.reallocation.scope
				<< ", returnedPtr=" << tcu::toHex(record.data.reallocation.returnedPtr);
			break;

		case AllocationCallbackRecord::TYPE_FREE:
			str << "FREE: mem=" << tcu::toHex(record.data.free.mem);
			break;

		case AllocationCallbackRecord::TYPE_INTERNAL_ALLOCATION:
		case AllocationCallbackRecord::TYPE_INTERNAL_FREE:
			str << "INTERNAL_" << (record.type == AllocationCallbackRecord::TYPE_INTERNAL_ALLOCATION ? "ALLOCATION" : "FREE")
				<< ": size=" << record.data.internalAllocation.size
				<< ", type=" << record.data.internalAllocation.type
				<< ", scope=" << record.data.internalAllocation.scope;
			break;

		default:
			DE_ASSERT(false);
	}

	return str;
}